

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QStringList *
QFileDialog::getOpenFileNames
          (QWidget *parent,QString *caption,QString *dir,QString *filter,QString *selectedFilter,
          Options options)

{
  bool bVar1;
  QList<QString> *in_RDX;
  QUrl *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_00000008;
  QUrl *url;
  QList<QUrl> *__range1;
  QStringList *fileNames;
  char16_t *str;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QUrl> selectedUrls;
  QStringList schemes;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffeac;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffeb0;
  QList<QString> *this;
  QString *in_stack_fffffffffffffec0;
  QWidget *parent_00;
  QList<QString> *asize;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_b4;
  undefined1 local_b0 [24];
  QUrl *local_98;
  const_iterator local_90;
  const_iterator in_stack_ffffffffffffff78;
  QFlagsStorage<QFileDialog::Option> options_00;
  QUrl local_78;
  Data *local_70;
  QStringList *supportedSchemes;
  QArrayDataPointer<char16_t> local_58 [2];
  QList<QString> local_28;
  undefined4 local_c;
  long local_8;
  
  options_00.i = (Int)((ulong)in_stack_ffffffffffffff78.i >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_stack_00000008;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  parent_00 = in_RDI;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_58,(Data *)0x0,L"file",4);
  QString::QString((QString *)in_stack_fffffffffffffeb0,
                   (DataPointer *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  QList<QString>::QList<QString,void>
            ((QList<QString> *)in_stack_fffffffffffffeb0,
             (QString *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  QString::~QString((QString *)0x759e89);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffeb0);
  local_70 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  supportedSchemes = (QStringList *)&DAT_aaaaaaaaaaaaaaaa;
  asize = in_RDX;
  QUrl::fromLocalFile((QString *)&local_78);
  this = &local_28;
  getOpenFileUrls(parent_00,(QString *)in_RDX,in_RSI,(QString *)in_RDI,in_stack_fffffffffffffec0,
                  (Options)options_00.i,supportedSchemes);
  QUrl::~QUrl(&local_78);
  *(undefined1 **)parent_00 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&parent_00->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&parent_00->super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x759f75);
  QList<QUrl>::size((QList<QUrl> *)&local_70);
  QList<QString>::reserve(in_RDX,(qsizetype)asize);
  QList<QUrl>::begin((QList<QUrl> *)this);
  local_90.i = (QUrl *)&DAT_aaaaaaaaaaaaaaaa;
  local_90 = QList<QUrl>::end((QList<QUrl> *)this);
  uVar2 = local_c;
  while( true ) {
    local_98 = local_90.i;
    bVar1 = QList<QUrl>::const_iterator::operator!=
                      ((const_iterator *)&stack0xffffffffffffff78,local_90);
    if (!bVar1) break;
    QList<QUrl>::const_iterator::operator*((const_iterator *)&stack0xffffffffffffff78);
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              (&local_b4,PreferLocalFile);
    QUrl::toString((QUrlTwoFlags_conflict *)local_b0);
    QList<QString>::append(this,(rvalue_ref)CONCAT44(in_stack_fffffffffffffeac,uVar2));
    QString::~QString((QString *)0x75a090);
    QList<QUrl>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffff78);
  }
  QList<QUrl>::~QList((QList<QUrl> *)0x75a0c5);
  QList<QString>::~QList((QList<QString> *)0x75a0d2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QStringList *)in_RDI;
}

Assistant:

QStringList QFileDialog::getOpenFileNames(QWidget *parent,
                                          const QString &caption,
                                          const QString &dir,
                                          const QString &filter,
                                          QString *selectedFilter,
                                          Options options)
{
    const QStringList schemes = QStringList(QStringLiteral("file"));
    const QList<QUrl> selectedUrls = getOpenFileUrls(parent, caption, QUrl::fromLocalFile(dir),
                                                     filter, selectedFilter, options, schemes);
    QStringList fileNames;
    fileNames.reserve(selectedUrls.size());
    for (const QUrl &url : selectedUrls)
        fileNames.append(url.toString(QUrl::PreferLocalFile));
    return fileNames;
}